

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolution3DLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  expectedUnits;
  undefined4 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int32 iVar5;
  string *psVar6;
  WeightParams *pWVar7;
  uint64_t outChannels;
  RepeatedField<float> *this_00;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  undefined1 local_c28 [72];
  undefined1 local_be0 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  undefined1 local_b78 [8];
  string err_12;
  undefined1 local_b30 [32];
  undefined1 local_b10 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  string local_a50;
  int bias_size;
  allocator local_a01;
  undefined1 local_a00 [32];
  Result local_9e0;
  uint64_t expected_weight_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  undefined1 local_948 [8];
  string err_10;
  undefined1 local_908 [8];
  string err_9;
  string local_8c8;
  undefined1 local_8a0 [7];
  bool is_deconv;
  undefined1 local_880 [72];
  undefined1 local_838 [72];
  string local_7f0;
  WeightParamType local_7c8;
  WeightParamType WStack_7c4;
  bool has_bias;
  WeightParamType biasValueType;
  WeightParamType weightsValueType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  undefined1 local_780 [8];
  string err_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  undefined1 local_720 [8];
  string err_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  undefined1 local_6c0 [8];
  string err_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  undefined1 local_660 [8];
  string err_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  undefined1 local_600 [8];
  string err_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0;
  int local_578;
  int customPaddingRight;
  int customPaddingLeft;
  int customPaddingBottom;
  int customPaddingTop;
  int customPaddingBack;
  int customPaddingFront;
  Result local_540;
  undefined1 local_510 [32];
  Result local_4f0;
  undefined1 local_4c0 [32];
  Result local_4a0;
  undefined1 local_470 [32];
  Result local_450;
  undefined1 local_420 [32];
  Result local_400;
  undefined1 local_3d0 [32];
  Result local_3b0;
  undefined1 local_380 [32];
  Result local_360;
  undefined1 local_330 [32];
  Result local_310;
  undefined1 local_2e0 [32];
  Result local_2c0;
  int kernelWidth;
  int kernelHeight;
  int kernelDepth;
  Result local_268;
  undefined1 local_238 [32];
  Result local_218;
  undefined1 local_1e8 [32];
  Result local_1c8;
  int32 local_198;
  int nGroups;
  int outputChannels;
  int inputChannels;
  string local_170;
  Convolution3DLayerParams *params;
  undefined1 local_140 [32];
  Result local_120;
  undefined1 local_f0 [32];
  undefined1 local_d0 [40];
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  if (bVar3) {
    validateOutputCount((Result_conflict *)(local_d0 + 0x28),(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_d0 + 0x28));
    Result::~Result((Result *)(local_d0 + 0x28));
    bVar3 = Result::good((Result *)(local_70 + 0x28));
    uVar2 = r._32_8_;
    if (bVar3) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_f0,"Convolution3D",
                   (allocator *)((long)local_120.m_message._M_storage._M_storage + 7));
        validateInputOutputRankEquality
                  ((Result_conflict *)local_d0,(NeuralNetworkLayer *)uVar2,(string *)local_f0,
                   &this->blobNameToRank);
        Result::operator=((Result *)(local_70 + 0x28),(Result *)local_d0);
        Result::~Result((Result *)local_d0);
        std::__cxx11::string::~string((string *)local_f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)local_120.m_message._M_storage._M_storage + 7));
        bVar3 = Result::good((Result *)(local_70 + 0x28));
        uVar2 = r._32_8_;
        if (!bVar3) {
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          goto LAB_003f83fc;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_140,"Convolution3D",(allocator *)((long)&params + 7));
        validateRankCount((Result_conflict *)(local_140 + 0x20),(NeuralNetworkLayer *)uVar2,
                          (string *)local_140,5,-1,&this->blobNameToRank);
        Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_140 + 0x20));
        Result::~Result((Result *)(local_140 + 0x20));
        std::__cxx11::string::~string((string *)local_140);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar3 = Result::good((Result *)(local_70 + 0x28));
        if (!bVar3) {
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          goto LAB_003f83fc;
        }
      }
      local_170._M_storage._M_storage =
           (uchar  [8])
           Specification::NeuralNetworkLayer::convolution3d((NeuralNetworkLayer *)r._32_8_);
      iVar4 = Specification::NeuralNetworkLayer::input_size((NeuralNetworkLayer *)r._32_8_);
      if (iVar4 == 1) {
        nGroups = Specification::Convolution3DLayerParams::inputchannels
                            ((Convolution3DLayerParams *)local_170._M_storage._M_storage);
        local_198 = Specification::Convolution3DLayerParams::outputchannels
                              ((Convolution3DLayerParams *)local_170._M_storage._M_storage);
        local_1c8.m_message._M_storage._M_storage._4_4_ =
             Specification::Convolution3DLayerParams::ngroups
                       ((Convolution3DLayerParams *)local_170._M_storage._M_storage);
        iVar4 = nGroups;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_1e8,"Input Channels",
                   (allocator *)((long)local_218.m_message._M_storage._M_storage + 7));
        validatePositive((Result_conflict *)(local_1e8 + 0x20),iVar4,(string *)local_1e8);
        Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_1e8 + 0x20));
        Result::~Result((Result *)(local_1e8 + 0x20));
        std::__cxx11::string::~string((string *)local_1e8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)local_218.m_message._M_storage._M_storage + 7));
        bVar3 = Result::good((Result *)(local_70 + 0x28));
        iVar5 = local_198;
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_238,"Output Channels",
                     (allocator *)(local_268.m_message._M_storage._M_storage + 7));
          validatePositive((Result_conflict *)(local_238 + 0x20),iVar5,(string *)local_238);
          Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_238 + 0x20));
          Result::~Result((Result *)(local_238 + 0x20));
          std::__cxx11::string::~string((string *)local_238);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(local_268.m_message._M_storage._M_storage + 7));
          bVar3 = Result::good((Result *)(local_70 + 0x28));
          uVar1 = local_1c8.m_message._M_storage._M_storage._4_4_;
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&kernelDepth,"Groups",(allocator *)((long)&kernelHeight + 3));
            validatePositive((Result_conflict *)&local_268,uVar1,(string *)&kernelDepth);
            Result::operator=((Result *)(local_70 + 0x28),&local_268);
            Result::~Result(&local_268);
            std::__cxx11::string::~string((string *)&kernelDepth);
            std::allocator<char>::~allocator((allocator<char> *)((long)&kernelHeight + 3));
            bVar3 = Result::good((Result *)(local_70 + 0x28));
            if (bVar3) {
              kernelWidth = Specification::Convolution3DLayerParams::kerneldepth
                                      ((Convolution3DLayerParams *)local_170._M_storage._M_storage);
              local_2c0.m_message._M_storage._M_storage._4_4_ =
                   Specification::Convolution3DLayerParams::kernelheight
                             ((Convolution3DLayerParams *)local_170._M_storage._M_storage);
              local_2c0.m_message._M_storage._M_storage._0_4_ =
                   Specification::Convolution3DLayerParams::kernelwidth
                             ((Convolution3DLayerParams *)local_170._M_storage._M_storage);
              iVar4 = kernelWidth;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_2e0,"Kernel Depth",
                         (allocator *)((long)local_310.m_message._M_storage._M_storage + 7));
              validatePositive((Result_conflict *)(local_2e0 + 0x20),iVar4,(string *)local_2e0);
              Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_2e0 + 0x20));
              Result::~Result((Result *)(local_2e0 + 0x20));
              std::__cxx11::string::~string((string *)local_2e0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)local_310.m_message._M_storage._M_storage + 7));
              bVar3 = Result::good((Result *)(local_70 + 0x28));
              uVar1 = local_2c0.m_message._M_storage._M_storage._4_4_;
              if (bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)local_330,"Kernel Height",
                           (allocator *)((long)local_360.m_message._M_storage._M_storage + 7));
                validatePositive((Result_conflict *)(local_330 + 0x20),uVar1,(string *)local_330);
                Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_330 + 0x20));
                Result::~Result((Result *)(local_330 + 0x20));
                std::__cxx11::string::~string((string *)local_330);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)local_360.m_message._M_storage._M_storage + 7))
                ;
                bVar3 = Result::good((Result *)(local_70 + 0x28));
                uVar1 = local_2c0.m_message._M_storage._M_storage._0_4_;
                if (bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)local_380,"Kernel Width",
                             (allocator *)((long)local_3b0.m_message._M_storage._M_storage + 7));
                  validatePositive((Result_conflict *)(local_380 + 0x20),uVar1,(string *)local_380);
                  Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_380 + 0x20));
                  Result::~Result((Result *)(local_380 + 0x20));
                  std::__cxx11::string::~string((string *)local_380);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)local_3b0.m_message._M_storage._M_storage + 7));
                  bVar3 = Result::good((Result *)(local_70 + 0x28));
                  if (bVar3) {
                    iVar5 = Specification::Convolution3DLayerParams::stridedepth
                                      ((Convolution3DLayerParams *)local_170._M_storage._M_storage);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)local_3d0,"Stride Depth",
                               (allocator *)((long)local_400.m_message._M_storage._M_storage + 7));
                    validatePositive((Result_conflict *)(local_3d0 + 0x20),iVar5,(string *)local_3d0
                                    );
                    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_3d0 + 0x20));
                    Result::~Result((Result *)(local_3d0 + 0x20));
                    std::__cxx11::string::~string((string *)local_3d0);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)local_400.m_message._M_storage._M_storage + 7));
                    bVar3 = Result::good((Result *)(local_70 + 0x28));
                    if (bVar3) {
                      iVar5 = Specification::Convolution3DLayerParams::strideheight
                                        ((Convolution3DLayerParams *)local_170._M_storage._M_storage
                                        );
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)local_420,"Stride Height",
                                 (allocator *)((long)local_450.m_message._M_storage._M_storage + 7))
                      ;
                      validatePositive((Result_conflict *)(local_420 + 0x20),iVar5,
                                       (string *)local_420);
                      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_420 + 0x20));
                      Result::~Result((Result *)(local_420 + 0x20));
                      std::__cxx11::string::~string((string *)local_420);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)
                                 ((long)local_450.m_message._M_storage._M_storage + 7));
                      bVar3 = Result::good((Result *)(local_70 + 0x28));
                      if (bVar3) {
                        iVar5 = Specification::Convolution3DLayerParams::stridewidth
                                          ((Convolution3DLayerParams *)
                                           local_170._M_storage._M_storage);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_470,"Stride Width",
                                   (allocator *)
                                   ((long)local_4a0.m_message._M_storage._M_storage + 7));
                        validatePositive((Result_conflict *)(local_470 + 0x20),iVar5,
                                         (string *)local_470);
                        Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_470 + 0x20));
                        Result::~Result((Result *)(local_470 + 0x20));
                        std::__cxx11::string::~string((string *)local_470);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)
                                   ((long)local_4a0.m_message._M_storage._M_storage + 7));
                        bVar3 = Result::good((Result *)(local_70 + 0x28));
                        if (bVar3) {
                          iVar5 = Specification::Convolution3DLayerParams::dilationdepth
                                            ((Convolution3DLayerParams *)
                                             local_170._M_storage._M_storage);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_4c0,"Dilation Depth",
                                     (allocator *)
                                     ((long)local_4f0.m_message._M_storage._M_storage + 7));
                          validatePositive((Result_conflict *)(local_4c0 + 0x20),iVar5,
                                           (string *)local_4c0);
                          Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_4c0 + 0x20)
                                           );
                          Result::~Result((Result *)(local_4c0 + 0x20));
                          std::__cxx11::string::~string((string *)local_4c0);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)
                                     ((long)local_4f0.m_message._M_storage._M_storage + 7));
                          bVar3 = Result::good((Result *)(local_70 + 0x28));
                          if (bVar3) {
                            iVar5 = Specification::Convolution3DLayerParams::dilationheight
                                              ((Convolution3DLayerParams *)
                                               local_170._M_storage._M_storage);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)local_510,"Dilation Height",
                                       (allocator *)(local_540.m_message._M_storage._M_storage + 7))
                            ;
                            validatePositive((Result_conflict *)(local_510 + 0x20),iVar5,
                                             (string *)local_510);
                            Result::operator=((Result *)(local_70 + 0x28),
                                              (Result *)(local_510 + 0x20));
                            Result::~Result((Result *)(local_510 + 0x20));
                            std::__cxx11::string::~string((string *)local_510);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)
                                       (local_540.m_message._M_storage._M_storage + 7));
                            bVar3 = Result::good((Result *)(local_70 + 0x28));
                            if (bVar3) {
                              iVar5 = Specification::Convolution3DLayerParams::dilationwidth
                                                ((Convolution3DLayerParams *)
                                                 local_170._M_storage._M_storage);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)&customPaddingFront,"Dilation Width",
                                         (allocator *)((long)&customPaddingBack + 3));
                              validatePositive((Result_conflict *)&local_540,iVar5,
                                               (string *)&customPaddingFront);
                              Result::operator=((Result *)(local_70 + 0x28),&local_540);
                              Result::~Result(&local_540);
                              std::__cxx11::string::~string((string *)&customPaddingFront);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)((long)&customPaddingBack + 3));
                              bVar3 = Result::good((Result *)(local_70 + 0x28));
                              if (bVar3) {
                                customPaddingTop =
                                     Specification::Convolution3DLayerParams::custompaddingfront
                                               ((Convolution3DLayerParams *)
                                                local_170._M_storage._M_storage);
                                customPaddingBottom =
                                     Specification::Convolution3DLayerParams::custompaddingback
                                               ((Convolution3DLayerParams *)
                                                local_170._M_storage._M_storage);
                                customPaddingLeft =
                                     Specification::Convolution3DLayerParams::custompaddingtop
                                               ((Convolution3DLayerParams *)
                                                local_170._M_storage._M_storage);
                                customPaddingRight =
                                     Specification::Convolution3DLayerParams::custompaddingbottom
                                               ((Convolution3DLayerParams *)
                                                local_170._M_storage._M_storage);
                                local_578 = Specification::Convolution3DLayerParams::
                                            custompaddingleft((Convolution3DLayerParams *)
                                                              local_170._M_storage._M_storage);
                                local_5a0._M_storage._M_storage._4_4_ =
                                     Specification::Convolution3DLayerParams::custompaddingright
                                               ((Convolution3DLayerParams *)
                                                local_170._M_storage._M_storage);
                                if (customPaddingTop < 0) {
                                  std::__cxx11::to_string
                                            ((string *)&err_2.super__Rb_tree_node_base._M_right,
                                             customPaddingTop);
                                  std::operator+(&local_5c0,
                                                 "Custom Padding Front must be non-negative, got \'"
                                                 ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_2.super__Rb_tree_node_base._M_right);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_5a0,&local_5c0,"\'.");
                                  std::__cxx11::string::~string((string *)&local_5c0);
                                  std::__cxx11::string::~string
                                            ((string *)&err_2.super__Rb_tree_node_base._M_right);
                                  Result::Result((Result *)__return_storage_ptr__,
                                                 INVALID_MODEL_PARAMETERS,&local_5a0);
                                  local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                  local_a8.m_message._M_storage._M_storage[1] = '\0';
                                  local_a8.m_message._M_storage._M_storage[2] = '\0';
                                  local_a8.m_message._M_storage._M_storage[3] = '\0';
                                  std::__cxx11::string::~string((string *)&local_5a0);
                                }
                                else if (customPaddingBottom < 0) {
                                  std::__cxx11::to_string
                                            ((string *)&err_3.super__Rb_tree_node_base._M_right,
                                             customPaddingBottom);
                                  std::operator+(&local_620,
                                                 "Custom Padding Back must be non-negative, got \'",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_3.super__Rb_tree_node_base._M_right);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_600,&local_620,"\'.");
                                  std::__cxx11::string::~string((string *)&local_620);
                                  std::__cxx11::string::~string
                                            ((string *)&err_3.super__Rb_tree_node_base._M_right);
                                  Result::Result((Result *)__return_storage_ptr__,
                                                 INVALID_MODEL_PARAMETERS,(string *)local_600);
                                  local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                  local_a8.m_message._M_storage._M_storage[1] = '\0';
                                  local_a8.m_message._M_storage._M_storage[2] = '\0';
                                  local_a8.m_message._M_storage._M_storage[3] = '\0';
                                  std::__cxx11::string::~string((string *)local_600);
                                }
                                else if (customPaddingLeft < 0) {
                                  std::__cxx11::to_string
                                            ((string *)&err_4.super__Rb_tree_node_base._M_right,
                                             customPaddingLeft);
                                  std::operator+(&local_680,
                                                 "Custom Padding Top must be non-negative, got \'",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_4.super__Rb_tree_node_base._M_right);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_660,&local_680,"\'.");
                                  std::__cxx11::string::~string((string *)&local_680);
                                  std::__cxx11::string::~string
                                            ((string *)&err_4.super__Rb_tree_node_base._M_right);
                                  Result::Result((Result *)__return_storage_ptr__,
                                                 INVALID_MODEL_PARAMETERS,(string *)local_660);
                                  local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                  local_a8.m_message._M_storage._M_storage[1] = '\0';
                                  local_a8.m_message._M_storage._M_storage[2] = '\0';
                                  local_a8.m_message._M_storage._M_storage[3] = '\0';
                                  std::__cxx11::string::~string((string *)local_660);
                                }
                                else if (customPaddingRight < 0) {
                                  std::__cxx11::to_string
                                            ((string *)&err_5.super__Rb_tree_node_base._M_right,
                                             customPaddingRight);
                                  std::operator+(&local_6e0,
                                                 "Custom Padding Bottom must be non-negative, got \'"
                                                 ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_5.super__Rb_tree_node_base._M_right);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6c0,&local_6e0,"\'.");
                                  std::__cxx11::string::~string((string *)&local_6e0);
                                  std::__cxx11::string::~string
                                            ((string *)&err_5.super__Rb_tree_node_base._M_right);
                                  Result::Result((Result *)__return_storage_ptr__,
                                                 INVALID_MODEL_PARAMETERS,(string *)local_6c0);
                                  local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                  local_a8.m_message._M_storage._M_storage[1] = '\0';
                                  local_a8.m_message._M_storage._M_storage[2] = '\0';
                                  local_a8.m_message._M_storage._M_storage[3] = '\0';
                                  std::__cxx11::string::~string((string *)local_6c0);
                                }
                                else if (local_578 < 0) {
                                  std::__cxx11::to_string
                                            ((string *)&err_6.super__Rb_tree_node_base._M_right,
                                             local_578);
                                  std::operator+(&local_740,
                                                 "customPadding Left must be non-negative, got \'",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_6.super__Rb_tree_node_base._M_right);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_720,&local_740,"\'.");
                                  std::__cxx11::string::~string((string *)&local_740);
                                  std::__cxx11::string::~string
                                            ((string *)&err_6.super__Rb_tree_node_base._M_right);
                                  Result::Result((Result *)__return_storage_ptr__,
                                                 INVALID_MODEL_PARAMETERS,(string *)local_720);
                                  local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                  local_a8.m_message._M_storage._M_storage[1] = '\0';
                                  local_a8.m_message._M_storage._M_storage[2] = '\0';
                                  local_a8.m_message._M_storage._M_storage[3] = '\0';
                                  std::__cxx11::string::~string((string *)local_720);
                                }
                                else if ((int)local_5a0._M_storage._M_storage._4_4_ < 0) {
                                  std::__cxx11::to_string
                                            ((string *)&biasValueType,
                                             local_5a0._M_storage._M_storage._4_4_);
                                  std::operator+(&local_7a0,
                                                 "customPadding Right must be non-negative, got \'",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&biasValueType);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_780,&local_7a0,"\'.");
                                  std::__cxx11::string::~string((string *)&local_7a0);
                                  std::__cxx11::string::~string((string *)&biasValueType);
                                  Result::Result((Result *)__return_storage_ptr__,
                                                 INVALID_MODEL_PARAMETERS,(string *)local_780);
                                  local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                  local_a8.m_message._M_storage._M_storage[1] = '\0';
                                  local_a8.m_message._M_storage._M_storage[2] = '\0';
                                  local_a8.m_message._M_storage._M_storage[3] = '\0';
                                  std::__cxx11::string::~string((string *)local_780);
                                }
                                else {
                                  pWVar7 = Specification::Convolution3DLayerParams::weights
                                                     ((Convolution3DLayerParams *)
                                                      local_170._M_storage._M_storage);
                                  WStack_7c4 = valueType(pWVar7);
                                  pWVar7 = Specification::Convolution3DLayerParams::bias
                                                     ((Convolution3DLayerParams *)
                                                      local_170._M_storage._M_storage);
                                  local_7c8 = valueType(pWVar7);
                                  local_7f0._M_storage._M_storage[7] =
                                       Specification::Convolution3DLayerParams::hasbias
                                                 ((Convolution3DLayerParams *)
                                                  local_170._M_storage._M_storage);
                                  if ((WStack_7c4 == UNSPECIFIED) ||
                                     (((bool)local_7f0._M_storage._M_storage[7] &&
                                      (local_7c8 == UNSPECIFIED)))) {
                                    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                       ((NeuralNetworkLayer *)r._32_8_);
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_838 + 0x28),"Convolution3D layer \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_7f0,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_838 + 0x28),
                                                  "\'  has invalid weights/bias fields.");
                                    std::__cxx11::string::~string((string *)(local_838 + 0x28));
                                    Result::Result((Result *)local_838,INVALID_MODEL_PARAMETERS,
                                                   &local_7f0);
                                    Result::operator=((Result *)(local_70 + 0x28),
                                                      (Result *)local_838);
                                    Result::~Result((Result *)local_838);
                                    Result::Result((Result *)__return_storage_ptr__,
                                                   (Result *)(local_70 + 0x28));
                                    local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                    local_a8.m_message._M_storage._M_storage[1] = '\0';
                                    local_a8.m_message._M_storage._M_storage[2] = '\0';
                                    local_a8.m_message._M_storage._M_storage[3] = '\0';
                                    std::__cxx11::string::~string((string *)&local_7f0);
                                  }
                                  else if (((bool)local_7f0._M_storage._M_storage[7]) &&
                                          (((WStack_7c4 == FLOAT16 && (local_7c8 == FLOAT32)) ||
                                           ((WStack_7c4 == FLOAT32 && (local_7c8 == FLOAT16)))))) {
                                    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                       ((NeuralNetworkLayer *)r._32_8_);
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_8a0,"Convolution3D layer \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_880,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_8a0,
                                                  "\' has unmatched precisions of weights/bias They should either be half or full precision."
                                                  );
                                    Result::Result((Result *)(local_880 + 0x20),
                                                   INVALID_MODEL_PARAMETERS,(string *)local_880);
                                    Result::operator=((Result *)(local_70 + 0x28),
                                                      (Result *)(local_880 + 0x20));
                                    Result::~Result((Result *)(local_880 + 0x20));
                                    std::__cxx11::string::~string((string *)local_880);
                                    std::__cxx11::string::~string((string *)local_8a0);
                                    Result::Result((Result *)__return_storage_ptr__,
                                                   (Result *)(local_70 + 0x28));
                                    local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                    local_a8.m_message._M_storage._M_storage[1] = '\0';
                                    local_a8.m_message._M_storage._M_storage[2] = '\0';
                                    local_a8.m_message._M_storage._M_storage[3] = '\0';
                                  }
                                  else {
                                    local_8c8._M_storage._M_storage[7] =
                                         Specification::Convolution3DLayerParams::isdeconvolution
                                                   ((Convolution3DLayerParams *)
                                                    local_170._M_storage._M_storage);
                                    iVar4 = Specification::Convolution3DLayerParams::
                                            outputshape_size((Convolution3DLayerParams *)
                                                             local_170._M_storage._M_storage);
                                    if (iVar4 != 0) {
                                      if ((local_8c8._M_storage._M_storage[7] & 1) == 0) {
                                        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                           ((NeuralNetworkLayer *)r._32_8_);
                                        std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_9.super__Rb_tree_node_base._M_right,
                                                  "Deconvolution3D Layer \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                        std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_8c8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_9.super__Rb_tree_node_base._M_right,
                                                  "\' Output Shape is supported for Deconvolution layer."
                                                  );
                                        std::__cxx11::string::~string
                                                  ((string *)
                                                   &err_9.super__Rb_tree_node_base._M_right);
                                        Result::Result((Result *)__return_storage_ptr__,
                                                       INVALID_MODEL_PARAMETERS,&local_8c8);
                                        local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                        local_a8.m_message._M_storage._M_storage[1] = '\0';
                                        local_a8.m_message._M_storage._M_storage[2] = '\0';
                                        local_a8.m_message._M_storage._M_storage[3] = '\0';
                                        std::__cxx11::string::~string((string *)&local_8c8);
                                        goto LAB_003f83fc;
                                      }
                                      iVar4 = Specification::Convolution3DLayerParams::
                                              outputshape_size((Convolution3DLayerParams *)
                                                               local_170._M_storage._M_storage);
                                      if (iVar4 != 3) {
                                        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                           ((NeuralNetworkLayer *)r._32_8_);
                                        std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_10.super__Rb_tree_node_base._M_right,
                                                  "Deconvolution3D layer: \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                        std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_908,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&err_10.super__Rb_tree_node_base._M_right,
                                                  "\' , if set, output shape must be of length 3.");
                                        std::__cxx11::string::~string
                                                  ((string *)
                                                   &err_10.super__Rb_tree_node_base._M_right);
                                        Result::Result((Result *)__return_storage_ptr__,
                                                       INVALID_MODEL_PARAMETERS,(string *)local_908)
                                        ;
                                        local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                        local_a8.m_message._M_storage._M_storage[1] = '\0';
                                        local_a8.m_message._M_storage._M_storage[2] = '\0';
                                        local_a8.m_message._M_storage._M_storage[3] = '\0';
                                        std::__cxx11::string::~string((string *)local_908);
                                        goto LAB_003f83fc;
                                      }
                                    }
                                    if (WStack_7c4 == QUINT) {
                                      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                         ((NeuralNetworkLayer *)r._32_8_);
                                      std::operator+(&local_988,"Layer \'",
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                      std::operator+(&local_968,&local_988,
                                                     "\' has invalid weights field. Quantized ");
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_948,&local_968,
                                                  "weights are not supported.");
                                      std::__cxx11::string::~string((string *)&local_968);
                                      std::__cxx11::string::~string((string *)&local_988);
                                      Result::Result((Result *)&expected_weight_size,
                                                     INVALID_MODEL_PARAMETERS,(string *)local_948);
                                      Result::operator=((Result *)(local_70 + 0x28),
                                                        (Result *)&expected_weight_size);
                                      Result::~Result((Result *)&expected_weight_size);
                                      Result::Result((Result *)__return_storage_ptr__,
                                                     (Result *)(local_70 + 0x28));
                                      local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                      local_a8.m_message._M_storage._M_storage[1] = '\0';
                                      local_a8.m_message._M_storage._M_storage[2] = '\0';
                                      local_a8.m_message._M_storage._M_storage[3] = '\0';
                                      std::__cxx11::string::~string((string *)local_948);
                                    }
                                    else {
                                      if ((local_8c8._M_storage._M_storage[7] & 1) == 0) {
                                        iVar4 = local_198 *
                                                (nGroups /
                                                (int)local_1c8.m_message._M_storage._M_storage._4_4_
                                                );
                                      }
                                      else {
                                        iVar4 = (local_198 /
                                                (int)local_1c8.m_message._M_storage._M_storage._4_4_
                                                ) * nGroups;
                                      }
                                      local_9e0.m_message._M_storage._M_storage =
                                           (uchar  [8])
                                           (long)(iVar4 * kernelWidth *
                                                  local_2c0.m_message._M_storage._M_storage._4_4_ *
                                                 local_2c0.m_message._M_storage._M_storage._0_4_);
                                      pWVar7 = Specification::Convolution3DLayerParams::weights
                                                         ((Convolution3DLayerParams *)
                                                          local_170._M_storage._M_storage);
                                      expectedUnits._M_storage =
                                           local_9e0.m_message._M_storage._M_storage;
                                      outChannels = (uint64_t)local_198;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)local_a00,"Convolution3D ",&local_a01);
                                      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                         ((NeuralNetworkLayer *)r._32_8_);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&bias_size,"weights",
                                                 (allocator *)(local_a50._M_storage._M_storage + 7))
                                      ;
                                      validateGeneralWeightParams
                                                ((Result_conflict *)(local_a00 + 0x20),pWVar7,
                                                 (uint64_t)expectedUnits._M_storage,outChannels,
                                                 (string *)local_a00,psVar6,(string *)&bias_size);
                                      Result::operator=((Result *)(local_70 + 0x28),
                                                        (Result *)(local_a00 + 0x20));
                                      Result::~Result((Result *)(local_a00 + 0x20));
                                      std::__cxx11::string::~string((string *)&bias_size);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (local_a50._M_storage._M_storage + 7));
                                      std::__cxx11::string::~string((string *)local_a00);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_a01);
                                      bVar3 = Result::good((Result *)(local_70 + 0x28));
                                      if (bVar3) {
                                        local_a50._M_storage._M_storage[0] = '\0';
                                        local_a50._M_storage._M_storage[1] = '\0';
                                        local_a50._M_storage._M_storage[2] = '\0';
                                        local_a50._M_storage._M_storage[3] = '\0';
                                        if ((local_7f0._M_storage._M_storage[7] & 1) != 0) {
                                          if ((local_7c8 != FLOAT32) && (local_7c8 != FLOAT16)) {
                                            if (local_7c8 == QUINT) {
                                              psVar6 = Specification::NeuralNetworkLayer::
                                                       name_abi_cxx11_((NeuralNetworkLayer *)
                                                                       r._32_8_);
                                              std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_be0 + 0x28),"Layer \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                              std::operator+(&local_b98,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_be0 + 0x28),
                                                  "\' has invalid bias field. Quantized ");
                                              std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b78,&local_b98,"bias is not supported.");
                                              std::__cxx11::string::~string((string *)&local_b98);
                                              std::__cxx11::string::~string
                                                        ((string *)(local_be0 + 0x28));
                                              Result::Result((Result *)local_be0,
                                                             INVALID_MODEL_PARAMETERS,
                                                             (string *)local_b78);
                                              Result::operator=((Result *)(local_70 + 0x28),
                                                                (Result *)local_be0);
                                              Result::~Result((Result *)local_be0);
                                              Result::Result((Result *)__return_storage_ptr__,
                                                             (Result *)(local_70 + 0x28));
                                              local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                              local_a8.m_message._M_storage._M_storage[1] = '\0';
                                              local_a8.m_message._M_storage._M_storage[2] = '\0';
                                              local_a8.m_message._M_storage._M_storage[3] = '\0';
                                              std::__cxx11::string::~string((string *)local_b78);
                                            }
                                            else {
                                              psVar6 = Specification::NeuralNetworkLayer::
                                                       name_abi_cxx11_((NeuralNetworkLayer *)
                                                                       r._32_8_);
                                              std::operator+(&local_c48,"Layer ",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                              std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_c28,&local_c48,"has not specified bias.");
                                              Result::Result((Result *)(local_c28 + 0x20),
                                                             INVALID_MODEL_PARAMETERS,
                                                             (string *)local_c28);
                                              Result::operator=((Result *)(local_70 + 0x28),
                                                                (Result *)(local_c28 + 0x20));
                                              Result::~Result((Result *)(local_c28 + 0x20));
                                              std::__cxx11::string::~string((string *)local_c28);
                                              std::__cxx11::string::~string((string *)&local_c48);
                                              Result::Result((Result *)__return_storage_ptr__,
                                                             (Result *)(local_70 + 0x28));
                                              local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                              local_a8.m_message._M_storage._M_storage[1] = '\0';
                                              local_a8.m_message._M_storage._M_storage[2] = '\0';
                                              local_a8.m_message._M_storage._M_storage[3] = '\0';
                                            }
                                            goto LAB_003f83fc;
                                          }
                                          if (local_7c8 == FLOAT32) {
                                            pWVar7 = Specification::Convolution3DLayerParams::bias
                                                               ((Convolution3DLayerParams *)
                                                                local_170._M_storage._M_storage);
                                            this_00 = Specification::WeightParams::floatvalue
                                                                (pWVar7);
                                            local_a50._M_storage._M_storage._0_4_ =
                                                 google::protobuf::RepeatedField<float>::size
                                                           (this_00);
                                          }
                                          else {
                                            pWVar7 = Specification::Convolution3DLayerParams::bias
                                                               ((Convolution3DLayerParams *)
                                                                local_170._M_storage._M_storage);
                                            Specification::WeightParams::float16value_abi_cxx11_
                                                      (pWVar7);
                                            uVar8 = std::__cxx11::string::size();
                                            local_a50._M_storage._M_storage._0_4_ =
                                                 SUB84(uVar8 >> 1,0);
                                          }
                                          if (local_a50._M_storage._M_storage._0_4_ != local_198) {
                                            psVar6 = Specification::NeuralNetworkLayer::
                                                     name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_)
                                            ;
                                            std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b10 + 0x20),"Convolution3D layer \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar6);
                                            std::operator+(&local_ad0,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b10 + 0x20),
                                                  "\' has a bias vector of size ");
                                            std::__cxx11::to_string
                                                      ((string *)local_b10,
                                                       local_a50._M_storage._M_storage._0_4_);
                                            std::operator+(&local_ab0,&local_ad0,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b10);
                                            std::operator+(&local_a90,&local_ab0," but should be ");
                                            std::__cxx11::to_string((string *)local_b30,local_198);
                                            std::operator+(&local_a70,&local_a90,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b30);
                                            std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_a50,&local_a70,".");
                                            std::__cxx11::string::~string((string *)&local_a70);
                                            std::__cxx11::string::~string((string *)local_b30);
                                            std::__cxx11::string::~string((string *)&local_a90);
                                            std::__cxx11::string::~string((string *)&local_ab0);
                                            std::__cxx11::string::~string((string *)local_b10);
                                            std::__cxx11::string::~string((string *)&local_ad0);
                                            std::__cxx11::string::~string
                                                      ((string *)(local_b10 + 0x20));
                                            Result::Result((Result *)
                                                           &err_12.super__Rb_tree_node_base._M_right
                                                           ,INVALID_MODEL_PARAMETERS,&local_a50);
                                            Result::operator=((Result *)(local_70 + 0x28),
                                                              (Result *)
                                                              &err_12.super__Rb_tree_node_base.
                                                               _M_right);
                                            Result::~Result((Result *)
                                                            &err_12.super__Rb_tree_node_base.
                                                             _M_right);
                                            Result::Result((Result *)__return_storage_ptr__,
                                                           (Result *)(local_70 + 0x28));
                                            local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                            local_a8.m_message._M_storage._M_storage[1] = '\0';
                                            local_a8.m_message._M_storage._M_storage[2] = '\0';
                                            local_a8.m_message._M_storage._M_storage[3] = '\0';
                                            std::__cxx11::string::~string((string *)&local_a50);
                                            goto LAB_003f83fc;
                                          }
                                        }
                                        Result::Result((Result *)__return_storage_ptr__,
                                                       (Result *)(local_70 + 0x28));
                                        local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                        local_a8.m_message._M_storage._M_storage[1] = '\0';
                                        local_a8.m_message._M_storage._M_storage[2] = '\0';
                                        local_a8.m_message._M_storage._M_storage[3] = '\0';
                                      }
                                      else {
                                        Result::Result((Result *)__return_storage_ptr__,
                                                       (Result *)(local_70 + 0x28));
                                        local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                        local_a8.m_message._M_storage._M_storage[1] = '\0';
                                        local_a8.m_message._M_storage._M_storage[2] = '\0';
                                        local_a8.m_message._M_storage._M_storage[3] = '\0';
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                Result::Result((Result *)__return_storage_ptr__,
                                               (Result *)(local_70 + 0x28));
                                local_a8.m_message._M_storage._M_storage[0] = '\x01';
                                local_a8.m_message._M_storage._M_storage[1] = '\0';
                                local_a8.m_message._M_storage._M_storage[2] = '\0';
                                local_a8.m_message._M_storage._M_storage[3] = '\0';
                              }
                            }
                            else {
                              Result::Result((Result *)__return_storage_ptr__,
                                             (Result *)(local_70 + 0x28));
                              local_a8.m_message._M_storage._M_storage[0] = '\x01';
                              local_a8.m_message._M_storage._M_storage[1] = '\0';
                              local_a8.m_message._M_storage._M_storage[2] = '\0';
                              local_a8.m_message._M_storage._M_storage[3] = '\0';
                            }
                          }
                          else {
                            Result::Result((Result *)__return_storage_ptr__,
                                           (Result *)(local_70 + 0x28));
                            local_a8.m_message._M_storage._M_storage[0] = '\x01';
                            local_a8.m_message._M_storage._M_storage[1] = '\0';
                            local_a8.m_message._M_storage._M_storage[2] = '\0';
                            local_a8.m_message._M_storage._M_storage[3] = '\0';
                          }
                        }
                        else {
                          Result::Result((Result *)__return_storage_ptr__,
                                         (Result *)(local_70 + 0x28));
                          local_a8.m_message._M_storage._M_storage[0] = '\x01';
                          local_a8.m_message._M_storage._M_storage[1] = '\0';
                          local_a8.m_message._M_storage._M_storage[2] = '\0';
                          local_a8.m_message._M_storage._M_storage[3] = '\0';
                        }
                      }
                      else {
                        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28))
                        ;
                        local_a8.m_message._M_storage._M_storage[0] = '\x01';
                        local_a8.m_message._M_storage._M_storage[1] = '\0';
                        local_a8.m_message._M_storage._M_storage[2] = '\0';
                        local_a8.m_message._M_storage._M_storage[3] = '\0';
                      }
                    }
                    else {
                      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                      local_a8.m_message._M_storage._M_storage[0] = '\x01';
                      local_a8.m_message._M_storage._M_storage[1] = '\0';
                      local_a8.m_message._M_storage._M_storage[2] = '\0';
                      local_a8.m_message._M_storage._M_storage[3] = '\0';
                    }
                  }
                  else {
                    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                    local_a8.m_message._M_storage._M_storage[0] = '\x01';
                    local_a8.m_message._M_storage._M_storage[1] = '\0';
                    local_a8.m_message._M_storage._M_storage[2] = '\0';
                    local_a8.m_message._M_storage._M_storage[3] = '\0';
                  }
                }
                else {
                  Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                  local_a8.m_message._M_storage._M_storage[0] = '\x01';
                  local_a8.m_message._M_storage._M_storage[1] = '\0';
                  local_a8.m_message._M_storage._M_storage[2] = '\0';
                  local_a8.m_message._M_storage._M_storage[3] = '\0';
                }
              }
              else {
                Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                local_a8.m_message._M_storage._M_storage[0] = '\x01';
                local_a8.m_message._M_storage._M_storage[1] = '\0';
                local_a8.m_message._M_storage._M_storage[2] = '\0';
                local_a8.m_message._M_storage._M_storage[3] = '\0';
              }
            }
            else {
              Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
              local_a8.m_message._M_storage._M_storage[0] = '\x01';
              local_a8.m_message._M_storage._M_storage[1] = '\0';
              local_a8.m_message._M_storage._M_storage[2] = '\0';
              local_a8.m_message._M_storage._M_storage[3] = '\0';
            }
          }
          else {
            Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
            local_a8.m_message._M_storage._M_storage[0] = '\x01';
            local_a8.m_message._M_storage._M_storage[1] = '\0';
            local_a8.m_message._M_storage._M_storage[2] = '\0';
            local_a8.m_message._M_storage._M_storage[3] = '\0';
          }
        }
        else {
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
        }
      }
      else {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &outputChannels,"Convolution3D layer: \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &outputChannels,"\', convolution3D does not support weight as input tensor.")
        ;
        std::__cxx11::string::~string((string *)&outputChannels);
        Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_170);
        local_a8.m_message._M_storage._M_storage[0] = '\x01';
        local_a8.m_message._M_storage._M_storage[1] = '\0';
        local_a8.m_message._M_storage._M_storage[2] = '\0';
        local_a8.m_message._M_storage._M_storage[3] = '\0';
        std::__cxx11::string::~string((string *)&local_170);
      }
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_a8.m_message._M_storage._M_storage[0] = '\x01';
      local_a8.m_message._M_storage._M_storage[1] = '\0';
      local_a8.m_message._M_storage._M_storage[2] = '\0';
      local_a8.m_message._M_storage._M_storage[3] = '\0';
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_a8.m_message._M_storage._M_storage[0] = '\x01';
    local_a8.m_message._M_storage._M_storage[1] = '\0';
    local_a8.m_message._M_storage._M_storage[2] = '\0';
    local_a8.m_message._M_storage._M_storage[3] = '\0';
  }
LAB_003f83fc:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolution3DLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution3D", blobNameToRank);
        if (!r.good()) { return r; }
        r = validateRankCount(layer, "Convolution3D", 5, -1, blobNameToRank);
        if (!r.good()) { return r; }
    }

    const auto& params = layer.convolution3d();

    if (layer.input_size() != 1) {
        std::string err = "Convolution3D layer: '" + layer.name() +
            "', convolution3D does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Validate input and output channels and number of convolution groups are positive
    int inputChannels = params.inputchannels();
    int outputChannels = params.outputchannels();
    int nGroups = params.ngroups();
    r = validatePositive(inputChannels, "Input Channels");
    if (!r.good()) { return r; }
    r = validatePositive(outputChannels, "Output Channels");
    if (!r.good()) { return r; }
    r = validatePositive(nGroups, "Groups");
    if (!r.good()) { return r; }

    // Validate kernel is positive
    int kernelDepth = params.kerneldepth();
    int kernelHeight = params.kernelheight();
    int kernelWidth = params.kernelwidth();
    r = validatePositive(kernelDepth, "Kernel Depth");
    if (!r.good()) { return r; }
    r = validatePositive(kernelHeight, "Kernel Height");
    if (!r.good()) { return r; }
    r = validatePositive(kernelWidth, "Kernel Width");
    if (!r.good()) { return r; }

    // Validate stride is positive
    r = validatePositive(params.stridedepth(), "Stride Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.strideheight(), "Stride Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.stridewidth(), "Stride Width");
    if (!r.good()) { return r; }

    // Validate dilation is positive
    r = validatePositive(params.dilationdepth(), "Dilation Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationheight(), "Dilation Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationwidth(), "Dilation Width");
    if (!r.good()) { return r; }

    // Validate padding
    int customPaddingFront = params.custompaddingfront();
    int customPaddingBack = params.custompaddingback();
    int customPaddingTop = params.custompaddingtop();
    int customPaddingBottom = params.custompaddingbottom();
    int customPaddingLeft = params.custompaddingleft();
    int customPaddingRight = params.custompaddingright();
    if (customPaddingFront < 0) {
        std::string err = "Custom Padding Front must be non-negative, got '" +
            std::to_string(customPaddingFront) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBack < 0) {
        std::string err = "Custom Padding Back must be non-negative, got '" +
            std::to_string(customPaddingBack) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingTop < 0) {
        std::string err = "Custom Padding Top must be non-negative, got '" +
            std::to_string(customPaddingTop) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBottom < 0) {
        std::string err = "Custom Padding Bottom must be non-negative, got '" +
            std::to_string(customPaddingBottom) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingLeft < 0) {
        std::string err = "customPadding Left must be non-negative, got '" +
            std::to_string(customPaddingLeft) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingRight < 0) {
        std::string err = "customPadding Right must be non-negative, got '" +
            std::to_string(customPaddingRight) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());
    bool has_bias = params.hasbias();

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution3D layer '" + layer.name() +
            "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution3D layer '" + layer.name() +
                "' has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    bool is_deconv = params.isdeconvolution();

    if (params.outputshape_size() != 0) {
        if (!is_deconv) {
            std::string err = "Deconvolution3D Layer '" + layer.name() + "' Output Shape is supported for Deconvolution layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else if (params.outputshape_size() != 3) {
            std::string err = "Deconvolution3D layer: '" + layer.name() + "' , if set, output shape must be of length 3.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    // Manually check if weights are quantized--we don't currently support them and
    // `validateGeneralWeightParams` allows them
    if (weightsValueType == QUINT) {
        std::string err = "Layer '" + layer.name() + "' has invalid weights field. Quantized " +
            "weights are not supported.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    uint64_t expected_weight_size = 0;
    if (is_deconv) {
        expected_weight_size = static_cast<uint64_t>((outputChannels / nGroups) * inputChannels * kernelDepth * kernelHeight * kernelWidth);
    } else {
        expected_weight_size = static_cast<uint64_t>(outputChannels * (inputChannels / nGroups) * kernelDepth * kernelHeight * kernelWidth);
    }
    r = validateGeneralWeightParams(params.weights(), expected_weight_size, uint64_t(outputChannels),
                                    "Convolution3D ", layer.name(), "weights");
    if (!r.good()) { return r; }

    // Check the bias
    int bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = params.bias().floatvalue().size();
            } else {
                bias_size = int(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution3D layer '" + layer.name() +
                    "' has a bias vector of size " + std::to_string(bias_size) + " but should be " +
                    std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // We don't currently support quantized parameters.
            std::string err = "Layer '" + layer.name() + "' has invalid bias field. Quantized " +
                "bias is not supported.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() +
                "has not specified bias.");
            return r;
        }
    }
    return r;
}